

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase * AnalyzeGenerator(ExpressionContext *ctx,SynGenerator *syntax)

{
  uint uVar1;
  Allocator *allocator;
  ScopeData *scope;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint offset;
  TypeBase *pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeFunction *pTVar6;
  TypeRef *contextType;
  SynBase *pSVar7;
  ExprVariableDefinition *pEVar8;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ExprBase *pEVar9;
  ExprBase *pEVar10;
  VariableData *pVVar11;
  undefined4 extraout_var_03;
  ExprBase *pEVar12;
  ExprBase *pEVar13;
  ExprVariableDefinition *first;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ExprFunctionAccess *this_00;
  char *pcVar14;
  IntrusiveList<SynBase> *pIVar15;
  InplaceStr name;
  ArrayView<ArgumentData> arguments_00;
  InplaceStr IVar16;
  InplaceStr name_00;
  IntrusiveList<ExprBase> expressions;
  SmallArray<ArgumentData,_32U> arguments;
  FunctionData *this;
  
  IVar16 = GetTemporaryFunctionName(ctx);
  SmallArray<ArgumentData,_32U>::SmallArray(&arguments,ctx->allocator);
  pTVar5 = CreateFunctionContextType(ctx,&syntax->super_SynBase,IVar16);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
  SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar3),IVar16);
  iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x338);
  this = (FunctionData *)CONCAT44(extraout_var_00,iVar4);
  allocator = ctx->allocator;
  scope = ctx->scope;
  arguments_00._12_4_ = 0;
  arguments_00.data = arguments.data;
  arguments_00.count = arguments.count;
  pTVar6 = ExpressionContext::GetFunctionType(ctx,&syntax->super_SynBase,ctx->typeAuto,arguments_00)
  ;
  contextType = ExpressionContext::GetReferenceType(ctx,pTVar5);
  uVar1 = ctx->uniqueFunctionId;
  ctx->uniqueFunctionId = uVar1 + 1;
  pcVar14 = (char *)0x1;
  FunctionData::FunctionData
            (this,allocator,&syntax->super_SynBase,scope,true,false,false,pTVar6,
             &contextType->super_TypeBase,(SynIdentifier *)CONCAT44(extraout_var,iVar3),
             (IntrusiveList<MatchData>)(ZEXT816(0) << 0x40),uVar1);
  IVar16.end = pcVar14;
  IVar16.begin = (this->name->name).end;
  anon_unknown.dwarf_94284::CheckFunctionConflict
            ((anon_unknown_dwarf_94284 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(this->name->name).begin,IVar16);
  ExpressionContext::AddFunction(ctx,this);
  ExpressionContext::PushScope(ctx,this);
  this->functionScope = ctx->scope;
  pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
  pEVar8 = CreateFunctionContextArgument(ctx,pSVar7,this);
  this->argumentsSize = this->functionScope->dataSize;
  expressions.head = (ExprBase *)0x0;
  expressions.tail = (ExprBase *)0x0;
  if (this->coroutine == true) {
    offset = anon_unknown.dwarf_94284::AllocateVariableInScope
                       (ctx,&syntax->super_SynBase,ctx->typeInt->alignment,ctx->typeInt);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    name.end = "";
    name.begin = "$jmpOffset";
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var_01,iVar3),name);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    pVVar11 = (VariableData *)CONCAT44(extraout_var_02,iVar4);
    uVar1 = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uVar1 + 1;
    VariableData::VariableData
              (pVVar11,ctx->allocator,&syntax->super_SynBase,ctx->scope,0,ctx->typeInt,
               (SynIdentifier *)CONCAT44(extraout_var_01,iVar3),offset,uVar1);
    this->coroutineJumpOffset = pVVar11;
    bVar2 = anon_unknown.dwarf_94284::IsLookupOnlyVariable(ctx,pVVar11);
    if (bVar2) {
      pVVar11->lookupOnly = true;
    }
    ExpressionContext::AddVariable(ctx,pVVar11,false);
    AddFunctionCoroutineVariable(ctx,&syntax->super_SynBase,this,this->coroutineJumpOffset);
    pEVar9 = CreateVariableAccess(ctx,&syntax->super_SynBase,this->coroutineJumpOffset,true);
  }
  else {
    pEVar9 = (ExprBase *)0x0;
  }
  pIVar15 = &syntax->expressions;
  while (pSVar7 = pIVar15->head, pSVar7 != (SynBase *)0x0) {
    pEVar10 = AnalyzeStatement(ctx,pSVar7);
    IntrusiveList<ExprBase>::push_back(&expressions,pEVar10);
    pIVar15 = (IntrusiveList<SynBase> *)&pSVar7->next;
  }
  if (this->hasExplicitReturn == false) {
    pcVar14 = "ERROR: not a single element is generated, and an array element type is unknown";
  }
  else {
    pTVar5 = this->type->returnType;
    if (pTVar5 != ctx->typeVoid) {
      pVVar11 = anon_unknown.dwarf_94284::AllocateTemporary(ctx,&syntax->super_SynBase,pTVar5);
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
      pEVar10 = (ExprBase *)CONCAT44(extraout_var_03,iVar3);
      pTVar5 = ctx->typeVoid;
      pEVar12 = CreateVariableAccess(ctx,&syntax->super_SynBase,pVVar11,false);
      pEVar13 = CreateFunctionCoroutineStateUpdate(ctx,&syntax->super_SynBase,this,0);
      pSVar7 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
      pSVar7 = (SynBase *)CreateFunctionUpvalueClose(ctx,pSVar7,this,ctx->scope);
      pEVar10->typeID = 0x1c;
      pEVar10->source = &syntax->super_SynBase;
      pEVar10->type = pTVar5;
      pEVar10->next = (ExprBase *)0x0;
      pEVar10->listed = false;
      pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223b70;
      pEVar10[1]._vptr_ExprBase = (_func_int **)pEVar12;
      *(ExprBase **)&pEVar10[1].typeID = pEVar13;
      pEVar10[1].source = pSVar7;
      IntrusiveList<ExprBase>::push_back(&expressions,pEVar10);
      goto LAB_0015f0d8;
    }
    pcVar14 = "ERROR: cannot generate an array of \'void\' element type";
  }
  anon_unknown.dwarf_94284::Report(ctx,&syntax->super_SynBase,pcVar14);
LAB_0015f0d8:
  ClosePendingUpvalues(ctx,this);
  ExpressionContext::PopScope(ctx,SCOPE_FUNCTION);
  pVVar11 = CreateFunctionContextVariable(ctx,&syntax->super_SynBase,this,(FunctionData *)0x0);
  first = CreateFunctionContextVariableDefinition
                    (ctx,&syntax->super_SynBase,this,(FunctionData *)0x0,pVVar11);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x78);
  pEVar10 = (ExprBase *)CONCAT44(extraout_var_04,iVar3);
  pTVar6 = this->type;
  pEVar10->typeID = 0x24;
  pEVar10->source = &syntax->super_SynBase;
  pEVar10->type = &pTVar6->super_TypeBase;
  pEVar10->next = (ExprBase *)0x0;
  pEVar10->listed = false;
  pEVar10->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ba8;
  pEVar10[1]._vptr_ExprBase = (_func_int **)this;
  *(ExprVariableDefinition **)&pEVar10[1].typeID = pEVar8;
  pEVar10[1].source = (SynBase *)0x0;
  pEVar10[1].type = (TypeBase *)0x0;
  pEVar10[1].next = pEVar9;
  *(ExprBase **)&pEVar10[1].listed = expressions.head;
  pEVar10[2]._vptr_ExprBase = (_func_int **)expressions.tail;
  *(ExprVariableDefinition **)&pEVar10[2].typeID = first;
  pEVar10[2].source = (SynBase *)pVVar11;
  this->declaration = pEVar10;
  SmallArray<ExprBase_*,_128U>::push_back(&ctx->definitions,&this->declaration);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
  this_00 = (ExprFunctionAccess *)CONCAT44(extraout_var_05,iVar3);
  pTVar6 = this->type;
  pEVar9 = CreateFunctionContextAccess(ctx,&syntax->super_SynBase,this);
  ExprFunctionAccess::ExprFunctionAccess
            (this_00,&syntax->super_SynBase,&pTVar6->super_TypeBase,this,pEVar9);
  if (first != (ExprVariableDefinition *)0x0) {
    this_00 = (ExprFunctionAccess *)
              CreateSequence(ctx,&syntax->super_SynBase,&first->super_ExprBase,(ExprBase *)this_00);
  }
  name_00.end = "";
  name_00.begin = "__gen_list";
  pEVar9 = CreateFunctionCall1(ctx,&syntax->super_SynBase,name_00,&this_00->super_ExprBase,false,
                               true,true);
  SmallArray<ArgumentData,_32U>::~SmallArray(&arguments);
  return pEVar9;
}

Assistant:

ExprBase* AnalyzeGenerator(ExpressionContext &ctx, SynGenerator *syntax)
{
	InplaceStr functionName = GetTemporaryFunctionName(ctx);

	SmallArray<ArgumentData, 32> arguments(ctx.allocator);

	TypeBase *contextClassType = CreateFunctionContextType(ctx, syntax, functionName);

	SynIdentifier *functionNameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(functionName);

	FunctionData *function = new (ctx.get<FunctionData>()) FunctionData(ctx.allocator, syntax, ctx.scope, true, false, false, ctx.GetFunctionType(syntax, ctx.typeAuto, arguments), ctx.GetReferenceType(contextClassType), functionNameIdentifier, IntrusiveList<MatchData>(), ctx.uniqueFunctionId++);

	CheckFunctionConflict(ctx, syntax, function->name->name);

	ctx.AddFunction(function);

	ctx.PushScope(function);

	function->functionScope = ctx.scope;

	ExprVariableDefinition *contextArgumentDefinition = CreateFunctionContextArgument(ctx, ctx.MakeInternal(syntax), function);

	function->argumentsSize = function->functionScope->dataSize;

	ExprBase *coroutineStateRead = NULL;

	IntrusiveList<ExprBase> expressions;

	if(function->coroutine)
	{
		unsigned offset = AllocateVariableInScope(ctx, syntax, ctx.typeInt->alignment, ctx.typeInt);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$jmpOffset"));

		function->coroutineJumpOffset = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, ctx.typeInt, nameIdentifier, offset, ctx.uniqueVariableId++);

		if (IsLookupOnlyVariable(ctx, function->coroutineJumpOffset))
			function->coroutineJumpOffset->lookupOnly = true;

		ctx.AddVariable(function->coroutineJumpOffset, false);

		AddFunctionCoroutineVariable(ctx, syntax, function, function->coroutineJumpOffset);

		coroutineStateRead = CreateVariableAccess(ctx, syntax, function->coroutineJumpOffset, true);
	}

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	if(!function->hasExplicitReturn)
	{
		Report(ctx, syntax, "ERROR: not a single element is generated, and an array element type is unknown");
	}
	else if(function->type->returnType == ctx.typeVoid)
	{
		Report(ctx, syntax, "ERROR: cannot generate an array of 'void' element type");
	}
	else
	{
		VariableData *empty = AllocateTemporary(ctx, syntax, function->type->returnType);

		expressions.push_back(new (ctx.get<ExprReturn>()) ExprReturn(syntax, ctx.typeVoid, CreateVariableAccess(ctx, syntax, empty, false), CreateFunctionCoroutineStateUpdate(ctx, syntax, function, 0), CreateFunctionUpvalueClose(ctx, ctx.MakeInternal(syntax), function, ctx.scope)));
	}

	ClosePendingUpvalues(ctx, function);

	ctx.PopScope(SCOPE_FUNCTION);

	VariableData *contextVariable = CreateFunctionContextVariable(ctx, syntax, function, NULL);
	ExprVariableDefinition *contextVariableDefinition = CreateFunctionContextVariableDefinition(ctx, syntax, function, NULL, contextVariable);

	function->declaration = new (ctx.get<ExprFunctionDefinition>()) ExprFunctionDefinition(syntax, function->type, function, contextArgumentDefinition, IntrusiveList<ExprVariableDefinition>(), coroutineStateRead, expressions, contextVariableDefinition, contextVariable);

	ctx.definitions.push_back(function->declaration);

	ExprBase *access = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(syntax, function->type, function, CreateFunctionContextAccess(ctx, syntax, function));

	return CreateFunctionCall1(ctx, syntax, InplaceStr("__gen_list"), contextVariableDefinition ? CreateSequence(ctx, syntax, contextVariableDefinition, access) : access, false, true, true);
}